

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

string * __thiscall
Json::Reader::normalizeEOL_abi_cxx11_
          (string *__return_storage_ptr__,Reader *this,Location begin,Location end)

{
  Reader *pRVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  while (this != (Reader *)begin) {
    pRVar1 = (Reader *)
             ((long)&(this->nodes_).c.
                     super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                     super__Deque_impl_data._M_map + 1);
    if (*(char *)&(this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_map == '\r') {
      if ((pRVar1 != (Reader *)begin) &&
         (*(char *)((long)&(this->nodes_).c.
                           super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                           super__Deque_impl_data._M_map + 1) == '\n')) {
        pRVar1 = (Reader *)
                 ((long)&(this->nodes_).c.
                         super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                         super__Deque_impl_data._M_map + 2);
      }
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      this = pRVar1;
    }
    else {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      this = pRVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

JSONCPP_STRING Reader::normalizeEOL(Reader::Location begin, Reader::Location end) {
  JSONCPP_STRING normalized;
  normalized.reserve(static_cast<size_t>(end - begin));
  Reader::Location current = begin;
  while (current != end) {
    char c = *current++;
    if (c == '\r') {
      if (current != end && *current == '\n')
         // convert dos EOL
         ++current;
      // convert Mac EOL
      normalized += '\n';
    } else {
      normalized += c;
    }
  }
  return normalized;
}